

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O2

void __thiscall btSoftBody::Cluster::Cluster(Cluster *this)

{
  (this->m_masses).m_ownsMemory = true;
  (this->m_masses).m_data = (float *)0x0;
  (this->m_masses).m_size = 0;
  (this->m_masses).m_capacity = 0;
  (this->m_nodes).m_ownsMemory = true;
  (this->m_nodes).m_data = (Node **)0x0;
  (this->m_nodes).m_size = 0;
  (this->m_nodes).m_capacity = 0;
  (this->m_framerefs).m_ownsMemory = true;
  (this->m_framerefs).m_data = (btVector3 *)0x0;
  (this->m_framerefs).m_size = 0;
  (this->m_framerefs).m_capacity = 0;
  this->m_adamping = 0.0;
  this->m_matching = 0.0;
  this->m_leaf = (btDbvtNode *)0x0;
  this->m_ndamping = 0.0;
  this->m_ldamping = 0.0;
  this->m_maxSelfCollisionImpulse = 100.0;
  this->m_selfCollisionImpulseFactor = 0.01;
  this->m_containsAnchor = false;
  return;
}

Assistant:

Cluster() : m_leaf(0),m_ndamping(0),m_ldamping(0),m_adamping(0),m_matching(0) 
		,m_maxSelfCollisionImpulse(100.f),
		m_selfCollisionImpulseFactor(0.01f),
		m_containsAnchor(false)
		{}